

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_color(nk_context *ctx,nk_color color)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_context *local_178;
  nk_style_item local_170;
  nk_style_item local_150;
  nk_style_item local_130;
  nk_widget_layout_states local_110;
  undefined1 local_10c [4];
  nk_widget_layout_states state;
  nk_rect content;
  nk_rect bounds;
  int ret;
  nk_style_button button;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_color color_local;
  
  bounds.w = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4eca,"int nk_button_color(struct nk_context *, struct nk_color)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ecb,"int nk_button_color(struct nk_context *, struct nk_color)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ecc,"int nk_button_color(struct nk_context *, struct nk_color)");
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    ctx_local._4_4_ = 0.0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    local_110 = nk_widget((nk_rect *)&content.w,ctx);
    if (local_110 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = 0.0;
    }
    else {
      if ((local_110 == NK_WIDGET_ROM) || (local_178 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_178 = (nk_context *)0x0;
      }
      memcpy(&bounds.h,&(ctx->style).button,0xb0);
      nk_style_item_color(&local_130,color);
      bounds.h = (float)local_130.type;
      ret = local_130._4_4_;
      nk_style_item_color(&local_150,color);
      nk_style_item_color(&local_170,color);
      bounds.w = (float)nk_do_button(&ctx->last_widget_state,&pnVar1->buffer,stack0xffffffffffffff04
                                     ,(nk_style_button *)&bounds.h,&local_178->input,
                                     ctx->button_behavior,(nk_rect *)local_10c);
      nk_draw_button(&pnVar1->buffer,(nk_rect *)&content.w,ctx->last_widget_state,
                     (nk_style_button *)&bounds.h);
      ctx_local._4_4_ = bounds.w;
    }
  }
  return (int)ctx_local._4_4_;
}

Assistant:

NK_API int
nk_button_color(struct nk_context *ctx, struct nk_color color)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    struct nk_style_button button;

    int ret = 0;
    struct nk_rect bounds;
    struct nk_rect content;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    button = ctx->style.button;
    button.normal = nk_style_item_color(color);
    button.hover = nk_style_item_color(color);
    button.active = nk_style_item_color(color);
    ret = nk_do_button(&ctx->last_widget_state, &win->buffer, bounds,
                &button, in, ctx->button_behavior, &content);
    nk_draw_button(&win->buffer, &bounds, ctx->last_widget_state, &button);
    return ret;
}